

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool SparseKeyTest<8192,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  Blob<224> h;
  keytype k;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2000,pcVar2,(ulong)(uint)setbits
        );
  hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Blob<8192>::Blob(&k);
  memset(&k,0,0x400);
  if (iVar3 != 0) {
    Blob<224>::Blob(&h);
    (*hash.m_hash)(&k,0x400,0,&h);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(&hashes,&h);
  }
  SparseKeygenRecurse<Blob<8192>,Blob<224>>(hash.m_hash,0,setbits,inclusive,&k,&hashes);
  printf("%d keys\n",
         ((long)hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x1c & 0xffffffff,
         ((long)hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
               super__Vector_impl_data._M_start) % 0x1c);
  bVar1 = TestHashList<Blob<224>>(&hashes,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  std::_Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>);
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}